

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O0

void MIDIStreamer::Callback(uint uMsg,void *userdata,DWORD dwParam1,DWORD dwParam2)

{
  MIDIStreamer *self;
  DWORD dwParam2_local;
  DWORD dwParam1_local;
  void *userdata_local;
  uint uMsg_local;
  
  if ((*(int *)((long)userdata + 0xc4c) < 4) && (uMsg == 0x3c9)) {
    ServiceEvent((MIDIStreamer *)userdata);
  }
  return;
}

Assistant:

void MIDIStreamer::Callback(unsigned int uMsg, void *userdata, DWORD dwParam1, DWORD dwParam2)
{
	MIDIStreamer *self = (MIDIStreamer *)userdata;

	if (self->EndQueued >= 4)
	{
		return;
	}
	if (uMsg == MOM_DONE)
	{
#ifdef _WIN32
		if (self->PlayerThread != NULL)
		{
			SetEvent(self->BufferDoneEvent);
		}
		else
#endif
		{
			self->ServiceEvent();
		}
	}
}